

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlValidatePopElement(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem,xmlChar *qname)

{
  xmlValidState *pxVar1;
  int iVar2;
  xmlElementPtr elemDecl;
  xmlValidStatePtr state;
  int ret;
  xmlChar *qname_local;
  xmlNodePtr elem_local;
  xmlDocPtr doc_local;
  xmlValidCtxtPtr ctxt_local;
  
  state._4_4_ = 1;
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    ctxt_local._4_4_ = 0;
  }
  else {
    if ((0 < ctxt->vstateNr) && (ctxt->vstate != (xmlValidState *)0x0)) {
      pxVar1 = ctxt->vstate;
      if ((pxVar1->elemDecl != (xmlElementPtr)0x0) &&
         ((pxVar1->elemDecl->etype == XML_ELEMENT_TYPE_ELEMENT &&
          (pxVar1->exec != (xmlRegExecCtxtPtr)0x0)))) {
        iVar2 = xmlRegExecPushString(pxVar1->exec,(xmlChar *)0x0,(void *)0x0);
        if (iVar2 == 0) {
          xmlErrValidNode(ctxt,pxVar1->node,XML_DTD_CONTENT_MODEL,
                          "Element %s content does not follow the DTD, Expecting more child\n",
                          pxVar1->node->name,(xmlChar *)0x0,(xmlChar *)0x0);
        }
        state._4_4_ = (uint)(iVar2 != 0);
      }
      vstateVPop(ctxt);
    }
    ctxt_local._4_4_ = state._4_4_;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlValidatePopElement(xmlValidCtxtPtr ctxt, xmlDocPtr doc ATTRIBUTE_UNUSED,
                      xmlNodePtr elem ATTRIBUTE_UNUSED,
		      const xmlChar *qname ATTRIBUTE_UNUSED) {
    int ret = 1;

    if (ctxt == NULL)
        return(0);
/* printf("PopElem %s\n", qname); */
    if ((ctxt->vstateNr > 0) && (ctxt->vstate != NULL)) {
	xmlValidStatePtr state = ctxt->vstate;
	xmlElementPtr elemDecl;

	/*
	 * Check the new element against the content model of the new elem.
	 */
	if (state->elemDecl != NULL) {
	    elemDecl = state->elemDecl;

	    if (elemDecl->etype == XML_ELEMENT_TYPE_ELEMENT) {
		if (state->exec != NULL) {
		    ret = xmlRegExecPushString(state->exec, NULL, NULL);
		    if (ret == 0) {
			xmlErrValidNode(ctxt, state->node,
			                XML_DTD_CONTENT_MODEL,
	   "Element %s content does not follow the DTD, Expecting more child\n",
			       state->node->name, NULL,NULL);
		    } else {
			/*
			 * previous validation errors should not generate
			 * a new one here
			 */
			ret = 1;
		    }
		}
	    }
	}
	vstateVPop(ctxt);
    }
    return(ret);
}